

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void verifyOrthonormal<Imath_3_2::Matrix33<float>>(Matrix33<float> *A,BaseType_conflict2 threshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  long lVar11;
  long lVar12;
  Matrix33<float> tmp;
  float local_24;
  float local_20;
  float local_1c;
  float fStack_18;
  float fStack_14;
  float fStack_10;
  undefined8 local_c;
  float local_4;
  
  fVar1 = A->x[2][0];
  fVar2 = A->x[0][0];
  fVar3 = A->x[0][1];
  fVar4 = A->x[2][1];
  fVar5 = A->x[0][2];
  fVar6 = A->x[2][2];
  fVar7 = A->x[1][1];
  fVar8 = A->x[1][0];
  fVar9 = A->x[1][2];
  pfVar10 = &local_24;
  local_24 = fVar5 * fVar5 + fVar2 * fVar2 + fVar3 * fVar3;
  local_1c = fVar6 * fVar5 + fVar1 * fVar2 + fVar4 * fVar3;
  local_20 = fVar5 * fVar9 + fVar2 * fVar8 + fVar3 * fVar7;
  fStack_10 = fVar6 * fVar9 + fVar1 * fVar8 + fVar4 * fVar7;
  fStack_18 = local_20;
  fStack_14 = fVar9 * fVar9 + fVar8 * fVar8 + fVar7 * fVar7;
  local_c = CONCAT44(fStack_10,local_1c);
  local_4 = fVar6 * fVar6 + fVar1 * fVar1 + fVar4 * fVar4;
  lVar11 = 0;
  do {
    lVar12 = 0;
    do {
      if (lVar11 == lVar12) {
        if (threshold <= ABS(pfVar10[lVar12] + -1.0)) {
          __assert_fail("std::abs (prod[i][j] - 1) < threshold",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                        ,0x3c,
                        "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix33<float>]"
                       );
        }
      }
      else if (threshold <= ABS(pfVar10[lVar12])) {
        __assert_fail("std::abs (prod[i][j]) < threshold",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                      ,0x3e,
                      "void verifyOrthonormal(const TM &, const typename TM::BaseType) [TM = Imath_3_2::Matrix33<float>]"
                     );
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lVar11 = lVar11 + 1;
    pfVar10 = pfVar10 + 3;
  } while (lVar11 != 3);
  return;
}

Assistant:

void
verifyOrthonormal (const TM& A, const typename TM::BaseType threshold)
{
    const TM prod = A * A.transposed ();
    for (unsigned int i = 0; i < TM::dimensions (); ++i)
        for (unsigned int j = 0; j < TM::dimensions (); ++j)
            if (i == j)
                assert (std::abs (prod[i][j] - 1) < threshold);
            else
                assert (std::abs (prod[i][j]) < threshold);
}